

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_type.cpp
# Opt level: O1

czstring pstore::http::media_type_from_extension(czstring extension)

{
  int iVar1;
  long lVar2;
  difference_type __d;
  undefined **ppuVar3;
  ulong uVar4;
  ulong uVar6;
  char *pcVar7;
  undefined **ppuVar8;
  ulong uVar5;
  
  lVar2 = 0x10;
  ppuVar8 = (undefined **)&(anonymous_namespace)::media_types;
  ppuVar3 = &brokerface::fifo_path::default_pipe_name;
  do {
    iVar1 = strcmp(*(char **)((long)&(anonymous_namespace)::media_types + lVar2),
                   *(char **)((long)http_date::months._M_elems + lVar2 + 0x50));
    if (iVar1 < 0) {
      ppuVar3 = (undefined **)((long)&(anonymous_namespace)::media_types + lVar2);
      break;
    }
    lVar2 = lVar2 + 0x10;
  } while (lVar2 != 0xb0);
  if (ppuVar3 != &brokerface::fifo_path::default_pipe_name) {
    assert_failed("std::is_sorted ( begin, end, [] (media_type_entry const & lhs, media_type_entry const & rhs) noexcept { return std::strcmp (lhs.name, rhs.name) < 0; })"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/lib/http/media_type.cpp"
                  ,0x3a);
  }
  uVar5 = 0xb;
  do {
    uVar4 = uVar5 >> 1;
    iVar1 = strcmp(ppuVar8[uVar4 * 2],extension);
    uVar6 = uVar4;
    if (iVar1 < 0) {
      uVar6 = ~uVar4 + uVar5;
      ppuVar8 = ppuVar8 + uVar4 * 2 + 2;
    }
    uVar5 = uVar6;
  } while (0 < (long)uVar6);
  pcVar7 = "application/octet-stream";
  if ((ppuVar8 != &brokerface::fifo_path::default_pipe_name) &&
     (iVar1 = strcmp(extension,*ppuVar8), iVar1 == 0)) {
    pcVar7 = ppuVar8[1];
  }
  return pcVar7;
}

Assistant:

gsl::czstring PSTORE_NONNULL
        media_type_from_extension (gsl::czstring const PSTORE_NONNULL extension) {
            static auto const begin = std::begin (media_types);
            static auto const end = std::end (media_types);

            PSTORE_ASSERT (std::is_sorted (
                begin, end,
                [] (media_type_entry const & lhs, media_type_entry const & rhs) noexcept {
                    return std::strcmp (lhs.name, rhs.name) < 0;
                }));

            auto const pos = std::lower_bound (
                begin, end, extension,
                [] (media_type_entry const & mte, gsl::czstring const ext) noexcept {
                    return std::strcmp (mte.name, ext) < 0;
                });
            return pos != end && std::strcmp (extension, pos->name) == 0
                       ? pos->media_type
                       : "application/octet-stream";
        }